

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUISpriteBank * __thiscall
irr::gui::CGUIEnvironment::getSpriteBank(CGUIEnvironment *this,path *filename)

{
  bool bVar1;
  s32 sVar2;
  SSpriteBank *pSVar3;
  path *ppVar4;
  ulong uVar5;
  array<irr::gui::CGUIEnvironment::SSpriteBank> *in_RDI;
  double __x;
  s32 index;
  SSpriteBank b;
  undefined8 in_stack_ffffffffffffff88;
  u32 index_00;
  pointer other;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  array<irr::gui::CGUIEnvironment::SSpriteBank> *in_stack_ffffffffffffffa0;
  path *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  IGUISpriteBank *local_8;
  
  index_00 = (u32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  SSpriteBank::SSpriteBank((SSpriteBank *)0x3af2e2);
  irr::io::SNamedPath::setPath((SNamedPath *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar2 = core::array<irr::gui::CGUIEnvironment::SSpriteBank>::binary_search
                    (in_stack_ffffffffffffffa0,
                     (SSpriteBank *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (sVar2 == -1) {
    other = in_RDI[0xe].m_data.
            super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = irr::io::SNamedPath::getPath((SNamedPath *)&stack0xffffffffffffffa0);
    uVar5 = (**(code **)(*(long *)&(other->NamedPath).Path.str + 0xd8))(other,ppVar4);
    if ((uVar5 & 1) == 0) {
      bVar1 = core::string<char>::operator!=((string<char> *)in_RDI,(string<char> *)other);
      if (bVar1) {
        irr::io::SNamedPath::getPath((SNamedPath *)&stack0xffffffffffffffa0);
        os::Printer::log(__x);
      }
      local_8 = (IGUISpriteBank *)0x0;
    }
    else {
      local_8 = (IGUISpriteBank *)0x0;
    }
  }
  else {
    pSVar3 = core::array<irr::gui::CGUIEnvironment::SSpriteBank>::operator[](in_RDI,index_00);
    local_8 = pSVar3->Bank;
  }
  SSpriteBank::~SSpriteBank((SSpriteBank *)0x3af3cb);
  return local_8;
}

Assistant:

IGUISpriteBank *CGUIEnvironment::getSpriteBank(const io::path &filename)
{
	// search for the file name

	SSpriteBank b;
	b.NamedPath.setPath(filename);

	s32 index = Banks.binary_search(b);
	if (index != -1)
		return Banks[index].Bank;

	// we don't have this sprite bank, we should load it
	if (!FileSystem->existFile(b.NamedPath.getPath())) {
		if (filename != DefaultFontName) {
			os::Printer::log("Could not load sprite bank because the file does not exist", b.NamedPath.getPath(), ELL_DEBUG);
		}
		return 0;
	}

	// todo: load it!

	return 0;
}